

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darPrec.c
# Opt level: O1

void Dar_Permutations_rec(char **pRes,int nFact,int n,char *Array)

{
  char cVar1;
  ulong uVar2;
  long lVar3;
  int nFact_00;
  ulong uVar4;
  char **ppcVar5;
  long lVar6;
  
  if (n == 1) {
    **pRes = *Array;
  }
  else if (0 < n) {
    lVar6 = (long)(n + -1);
    nFact_00 = (int)((long)nFact / (long)n);
    lVar3 = (long)nFact_00;
    ppcVar5 = pRes + lVar3 * lVar6;
    uVar4 = 0;
    do {
      cVar1 = Array[uVar4];
      Array[uVar4] = Array[lVar6];
      Array[lVar6] = cVar1;
      if (0 < nFact_00) {
        uVar2 = 0;
        do {
          ppcVar5[uVar2][lVar6] = Array[lVar6];
          uVar2 = uVar2 + 1;
        } while (((long)nFact / (long)n & 0xffffffffU) != uVar2);
      }
      Dar_Permutations_rec(pRes + (lVar6 - uVar4) * lVar3,nFact_00,n + -1,Array);
      cVar1 = Array[uVar4];
      Array[uVar4] = Array[lVar6];
      Array[lVar6] = cVar1;
      uVar4 = uVar4 + 1;
      ppcVar5 = ppcVar5 + -lVar3;
    } while (uVar4 != (uint)n);
  }
  return;
}

Assistant:

void Dar_Permutations_rec( char ** pRes, int nFact, int n, char Array[] )
{
    char ** pNext;
    int nFactNext;
    int iTemp, iCur, iLast, k;

    if ( n == 1 )
    {
        pRes[0][0] = Array[0];
        return;
    }

    // get the next factorial
    nFactNext = nFact / n;
    // get the last entry
    iLast = n - 1;

    for ( iCur = 0; iCur < n; iCur++ )
    {
        // swap Cur and Last
        iTemp        = Array[iCur];
        Array[iCur]  = Array[iLast];
        Array[iLast] = iTemp;

        // get the pointer to the current section
        pNext = pRes + (n - 1 - iCur) * nFactNext;

        // set the last entry 
        for ( k = 0; k < nFactNext; k++ )
            pNext[k][iLast] = Array[iLast];

        // call recursively for this part
        Dar_Permutations_rec( pNext, nFactNext, n - 1, Array );

        // swap them back
        iTemp        = Array[iCur];
        Array[iCur]  = Array[iLast];
        Array[iLast] = iTemp;
    }
}